

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

void __thiscall
TMap<FState_*,_FScriptPosition,_THashTraits<FState_*>,_TValueTraits<FScriptPosition>_>::
SetNodeVector(TMap<FState_*,_FScriptPosition,_THashTraits<FState_*>,_TValueTraits<FScriptPosition>_>
              *this,hash_t size)

{
  undefined1 auVar1 [16];
  uint uVar2;
  Node *pNVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  uVar2 = 1;
  do {
    uVar4 = uVar2;
    uVar2 = uVar4 * 2;
  } while (uVar4 < size);
  this->Size = uVar4;
  pNVar3 = (Node *)M_Malloc_Dbg((ulong)uVar4 << 5,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./tarray.h"
                                ,0x33a);
  this->Nodes = pNVar3;
  uVar5 = (ulong)this->Size;
  this->LastFree = pNVar3 + uVar5;
  auVar1 = _DAT_005d6240;
  if (uVar5 != 0) {
    lVar6 = uVar5 - 1;
    auVar8._8_4_ = (int)lVar6;
    auVar8._0_8_ = lVar6;
    auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar7 = 0;
    auVar8 = auVar8 ^ _DAT_005d6240;
    auVar9 = _DAT_005d6230;
    do {
      auVar10 = auVar9 ^ auVar1;
      if ((bool)(~(auVar10._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar10._0_4_ ||
                  auVar8._4_4_ < auVar10._4_4_) & 1)) {
        *(undefined8 *)((long)&pNVar3->Next + uVar7) = 1;
      }
      if ((auVar10._12_4_ != auVar8._12_4_ || auVar10._8_4_ <= auVar8._8_4_) &&
          auVar10._12_4_ <= auVar8._12_4_) {
        *(undefined8 *)((long)&pNVar3[1].Next + uVar7) = 1;
      }
      lVar6 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar6 + 2;
      uVar7 = uVar7 + 0x40;
    } while ((uVar5 * 0x20 + 0x20 & 0xffffffffffffffc0) != uVar7);
  }
  return;
}

Assistant:

void SetNodeVector(hash_t size)
	{
		// Round size up to nearest power of 2
		for (Size = 1; Size < size; Size <<= 1)
		{ }
		Nodes = (Node *)M_Malloc(Size * sizeof(Node));
		LastFree = &Nodes[Size];	/* all positions are free */
		for (hash_t i = 0; i < Size; ++i)
		{
			Nodes[i].SetNil();
		}
	}